

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O0

int RSA_encrypt(RSA *rsa,size_t *out_len,uint8_t *out,size_t max_out,uint8_t *in,size_t in_len,
               int padding)

{
  BIGNUM *pBVar1;
  BN_MONT_CTX *pBVar2;
  bool bVar3;
  int iVar4;
  pointer pbVar5;
  BIGNUM *ret_00;
  BIGNUM *rr;
  uint8_t *to;
  BIGNUM *pBVar6;
  BN_MONT_CTX *pBVar7;
  int local_80;
  int local_7c;
  int ret;
  int i;
  uint8_t *buf;
  BIGNUM *result;
  BIGNUM *f;
  BN_CTXScope scope;
  unique_ptr<bignum_ctx,_bssl::internal::Deleter> local_50;
  UniquePtr<BN_CTX> ctx;
  uint rsa_size;
  size_t in_len_local;
  uint8_t *in_local;
  size_t max_out_local;
  uint8_t *out_local;
  size_t *out_len_local;
  RSA *rsa_local;
  
  if ((rsa->n == (BIGNUM *)0x0) || (rsa->e == (BIGNUM *)0x0)) {
    ERR_put_error(4,0,0x90,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0x157);
    return 0;
  }
  iVar4 = rsa_check_public_key(rsa);
  if (iVar4 == 0) {
    return 0;
  }
  ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_ = RSA_size((RSA *)rsa);
  if (max_out < ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_) {
    ERR_put_error(4,0,0x87,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0x161);
    return 0;
  }
  pbVar5 = (pointer)BN_CTX_new();
  std::unique_ptr<bignum_ctx,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_ctx,bssl::internal::Deleter> *)&local_50,pbVar5);
  bVar3 = std::operator==(&local_50,(nullptr_t)0x0);
  if (bVar3) {
    rsa_local._4_4_ = 0;
    scope.ctx_._4_4_ = 1;
    goto LAB_003f6dd3;
  }
  pbVar5 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_50);
  bssl::BN_CTXScope::BN_CTXScope((BN_CTXScope *)&f,pbVar5);
  pbVar5 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_50);
  ret_00 = BN_CTX_get((BN_CTX *)pbVar5);
  pbVar5 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_50);
  rr = BN_CTX_get((BN_CTX *)pbVar5);
  to = (uint8_t *)
       OPENSSL_malloc((ulong)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_);
  local_80 = 0;
  if (((ret_00 != (BIGNUM *)0x0) && (rr != (BIGNUM *)0x0)) && (to != (uint8_t *)0x0)) {
    if (padding == 1) {
      local_7c = rsa_padding_add_PKCS1_type_2
                           (to,(ulong)ctx._M_t.
                                      super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_,
                            in,in_len);
    }
    else if (padding == 3) {
      local_7c = RSA_padding_add_none
                           (to,ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_,in,
                            (int)in_len);
    }
    else {
      if (padding != 4) {
        ERR_put_error(4,0,0x8f,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                      ,0x180);
        goto LAB_003f6db4;
      }
      local_7c = RSA_padding_add_PKCS1_OAEP_mgf1
                           (to,(ulong)ctx._M_t.
                                      super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_,
                            in,in_len,(uint8_t *)0x0,0,(EVP_MD *)0x0,(EVP_MD *)0x0);
    }
    if ((0 < local_7c) &&
       (pBVar6 = BN_bin2bn(to,ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_,ret_00),
       pBVar6 != (BIGNUM *)0x0)) {
      iVar4 = BN_ucmp(ret_00,(BIGNUM *)rsa->n);
      if (iVar4 < 0) {
        pBVar1 = rsa->n;
        pbVar5 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_50);
        pBVar7 = BN_MONT_CTX_set_locked(&rsa->mont_n,&rsa->lock,pBVar1,pbVar5);
        if ((int)pBVar7 != 0) {
          pBVar1 = rsa->e;
          pBVar2 = rsa->mont_n;
          pbVar5 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_50);
          iVar4 = BN_mod_exp_mont((BIGNUM *)rr,(BIGNUM *)ret_00,pBVar1,&pBVar2->N,pbVar5,rsa->mont_n
                                 );
          if (iVar4 != 0) {
            iVar4 = BN_bn2bin_padded(out,(ulong)ctx._M_t.
                                                super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_bignum_ctx_*,_false>.
                                                _M_head_impl._4_4_,(BIGNUM *)rr);
            if (iVar4 == 0) {
              ERR_put_error(4,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                            ,0x19b);
            }
            else {
              *out_len = (ulong)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_;
              local_80 = 1;
            }
          }
        }
      }
      else {
        ERR_put_error(4,0,0x73,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                      ,0x18e);
      }
    }
  }
LAB_003f6db4:
  OPENSSL_free(to);
  rsa_local._4_4_ = local_80;
  scope.ctx_._4_4_ = 1;
  bssl::BN_CTXScope::~BN_CTXScope((BN_CTXScope *)&f);
LAB_003f6dd3:
  std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::~unique_ptr(&local_50);
  return rsa_local._4_4_;
}

Assistant:

int RSA_encrypt(RSA *rsa, size_t *out_len, uint8_t *out, size_t max_out,
                const uint8_t *in, size_t in_len, int padding) {
  if (rsa->n == NULL || rsa->e == NULL) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_VALUE_MISSING);
    return 0;
  }

  if (!rsa_check_public_key(rsa)) {
    return 0;
  }

  const unsigned rsa_size = RSA_size(rsa);
  if (max_out < rsa_size) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_OUTPUT_BUFFER_TOO_SMALL);
    return 0;
  }

  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  if (ctx == nullptr) {
    return 0;
  }

  bssl::BN_CTXScope scope(ctx.get());
  BIGNUM *f = BN_CTX_get(ctx.get());
  BIGNUM *result = BN_CTX_get(ctx.get());
  uint8_t *buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(rsa_size));
  int i, ret = 0;
  if (!f || !result || !buf) {
    goto err;
  }

  switch (padding) {
    case RSA_PKCS1_PADDING:
      i = rsa_padding_add_PKCS1_type_2(buf, rsa_size, in, in_len);
      break;
    case RSA_PKCS1_OAEP_PADDING:
      // Use the default parameters: SHA-1 for both hashes and no label.
      i = RSA_padding_add_PKCS1_OAEP_mgf1(buf, rsa_size, in, in_len, nullptr, 0,
                                          nullptr, nullptr);
      break;
    case RSA_NO_PADDING:
      i = RSA_padding_add_none(buf, rsa_size, in, in_len);
      break;
    default:
      OPENSSL_PUT_ERROR(RSA, RSA_R_UNKNOWN_PADDING_TYPE);
      goto err;
  }

  if (i <= 0) {
    goto err;
  }

  if (BN_bin2bn(buf, rsa_size, f) == nullptr) {
    goto err;
  }

  if (BN_ucmp(f, rsa->n) >= 0) {
    // usually the padding functions would catch this
    OPENSSL_PUT_ERROR(RSA, RSA_R_DATA_TOO_LARGE_FOR_MODULUS);
    goto err;
  }

  if (!BN_MONT_CTX_set_locked(&rsa->mont_n, &rsa->lock, rsa->n, ctx.get()) ||
      !BN_mod_exp_mont(result, f, rsa->e, &rsa->mont_n->N, ctx.get(),
                       rsa->mont_n)) {
    goto err;
  }

  // put in leading 0 bytes if the number is less than the length of the
  // modulus
  if (!BN_bn2bin_padded(out, rsa_size, result)) {
    OPENSSL_PUT_ERROR(RSA, ERR_R_INTERNAL_ERROR);
    goto err;
  }

  *out_len = rsa_size;
  ret = 1;

err:
  OPENSSL_free(buf);
  return ret;
}